

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O2

DdTlcInfo * Cudd_FindTwoLiteralClauses(DdManager *dd,DdNode *f)

{
  DdHalfWord *pDVar1;
  DdHalfWord DVar2;
  int iVar3;
  uint uVar4;
  st__table *table;
  DdTlcInfo *pDVar5;
  st__generator *gen;
  DdHalfWord *pDVar6;
  BitVector *__ptr;
  DdNode *node;
  DdTlcInfo *tlc;
  
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    pDVar5 = (DdTlcInfo *)malloc(0x18);
    if (pDVar5 != (DdTlcInfo *)0x0) {
      pDVar6 = (DdHalfWord *)malloc(8);
      pDVar5->vars = pDVar6;
      if (pDVar6 != (DdHalfWord *)0x0) {
        pDVar6[0] = 0;
        pDVar6[1] = 0;
        pDVar5->phases = (long *)0x0;
        pDVar5->cnt = 0;
        return pDVar5;
      }
      free(pDVar5);
    }
    return (DdTlcInfo *)0x0;
  }
  iVar3 = dd->size;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table != (st__table *)0x0) {
    Tolv = bitVectorAlloc(iVar3);
    if (Tolv == (BitVector *)0x0) {
      st__free_table(table);
    }
    else {
      Tolp = bitVectorAlloc(iVar3);
      if (Tolp == (BitVector *)0x0) {
        st__free_table(table);
        __ptr = Tolv;
      }
      else {
        Eolv = bitVectorAlloc(iVar3);
        if (Eolv == (BitVector *)0x0) {
          st__free_table(table);
          free(Tolv);
          __ptr = Tolp;
        }
        else {
          Eolp = bitVectorAlloc(iVar3);
          if (Eolp != (BitVector *)0x0) {
            pDVar5 = ddFindTwoLiteralClausesRecur(dd,f,table);
            gen = st__init_gen(table);
            while (iVar3 = st__gen(gen,(char **)&node,(char **)&tlc), iVar3 != 0) {
              if (node != f) {
                Cudd_tlcInfoFree(tlc);
              }
            }
            st__free_gen(gen);
            st__free_table(table);
            free(Tolv);
            free(Tolp);
            free(Eolv);
            free(Eolp);
            if (pDVar5 == (DdTlcInfo *)0x0) {
              return (DdTlcInfo *)0x0;
            }
            pDVar6 = pDVar5->vars + 1;
            uVar4 = 0xfffffffe;
            do {
              DVar2 = *pDVar6;
              uVar4 = uVar4 + 2;
              pDVar1 = pDVar6 + -1;
              pDVar6 = pDVar6 + 2;
            } while (DVar2 != 0 || *pDVar1 != 0);
            pDVar5->cnt = uVar4 >> 1;
            return pDVar5;
          }
          st__free_table(table);
          free(Tolv);
          free(Tolp);
          __ptr = Eolv;
        }
      }
      free(__ptr);
    }
  }
  return (DdTlcInfo *)0x0;
}

Assistant:

DdTlcInfo *
Cudd_FindTwoLiteralClauses(
  DdManager * dd,
  DdNode * f)
{
    DdTlcInfo *res;
    st__table *table;
    st__generator *gen;
    DdTlcInfo *tlc;
    DdNode *node;
    int size = dd->size;

    if (Cudd_IsConstant(f)) {
        res = emptyClauseSet();
        return(res);
    }
    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return(NULL);
    Tolv = bitVectorAlloc(size);
    if (Tolv == NULL) {
        st__free_table(table);
        return(NULL);
    }
    Tolp = bitVectorAlloc(size);
    if (Tolp == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        return(NULL);
    }
    Eolv = bitVectorAlloc(size);
    if (Eolv == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        bitVectorFree(Tolp);
        return(NULL);
    }
    Eolp = bitVectorAlloc(size);
    if (Eolp == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        bitVectorFree(Tolp);
        bitVectorFree(Eolv);
        return(NULL);
    }

    res = ddFindTwoLiteralClausesRecur(dd,f,table);
    /* Dispose of table contents and free table. */
    st__foreach_item(table, gen, (const char **)&node, (char **)&tlc) {
        if (node != f) {
            Cudd_tlcInfoFree(tlc);
        }
    }
    st__free_table(table);
    bitVectorFree(Tolv);
    bitVectorFree(Tolp);
    bitVectorFree(Eolv);
    bitVectorFree(Eolp);

    if (res != NULL) {
        int i;
        for (i = 0; !sentinelp(res->vars[i], res->vars[i+1]); i += 2);
        res->cnt = i >> 1;
    }

    return(res);

}